

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall amrex::MLCellLinOp::updateSolBC(MLCellLinOp *this,int amrlev,MultiFab *crse_bcdata)

{
  __uniq_ptr_data<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>,_true,_true>
  this_00;
  int num_comp;
  Periodicity local_38;
  
  if (amrlev < 1) {
    Assert_host("amrlev > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLCellLinOp.cpp"
                ,0x1fe,(char *)0x0);
  }
  num_comp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  this_00.super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>.
  super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl =
       (this->m_crse_sol_br).
       super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
       super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>;
  local_38 = Geometry::periodicity
                       (*(Geometry **)
                         &(this->super_MLLinOp).m_geom.
                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)amrlev + -1].
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  BndryRegister::copyFrom
            ((BndryRegister *)
             this_00.
             super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::BndryRegister_*,_std::default_delete<amrex::BndryRegister>_>
             .super__Head_base<0UL,_amrex::BndryRegister_*,_false>._M_head_impl,crse_bcdata,0,0,0,
             num_comp,&local_38);
  InterpBndryData::updateBndryValues
            ((InterpBndryData *)
             (this->m_bndry_sol).
             super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
             super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,
             (BndryRegister *)
             (this->m_crse_sol_br).
             super_vector<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>,_std::allocator<std::unique_ptr<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
             super___uniq_ptr_impl<amrex::BndryRegister,_std::default_delete<amrex::BndryRegister>_>
             ,0,0,num_comp,
             (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [(long)amrlev + -1],InterpBndryData::IBD_max_order_DEF);
  return;
}

Assistant:

void
MLCellLinOp::updateSolBC (int amrlev, const MultiFab& crse_bcdata) const
{
    BL_PROFILE("MLCellLinOp::updateSolBC()");

    AMREX_ALWAYS_ASSERT(amrlev > 0);
    const int ncomp = getNComp();
    m_crse_sol_br[amrlev]->copyFrom(crse_bcdata, 0, 0, 0, ncomp, m_geom[amrlev-1][0].periodicity());
    m_bndry_sol[amrlev]->updateBndryValues(*m_crse_sol_br[amrlev], 0, 0, ncomp, m_amr_ref_ratio[amrlev-1]);
}